

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O2

void * __thiscall irr::scene::SSkinMeshBuffer::getVertices(SSkinMeshBuffer *this)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  long lStack_8;
  
  if (this->VertexType == EVT_2TCOORDS) {
    lVar3 = 0x30;
    lStack_8 = 0x28;
  }
  else if (this->VertexType == EVT_TANGENTS) {
    lVar3 = 0x10;
    lStack_8 = 8;
  }
  else {
    lVar3 = 0x50;
    lStack_8 = 0x48;
  }
  pvVar1 = *(void **)((long)&(this->super_IMeshBuffer)._vptr_IMeshBuffer + lStack_8);
  pvVar2 = (void *)0x0;
  if (pvVar1 != *(void **)((long)&(this->super_IMeshBuffer)._vptr_IMeshBuffer + lVar3)) {
    pvVar2 = pvVar1;
  }
  return pvVar2;
}

Assistant:

const void *getVertices() const override
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return Vertices_2TCoords.const_pointer();
		case video::EVT_TANGENTS:
			return Vertices_Tangents.const_pointer();
		default:
			return Vertices_Standard.const_pointer();
		}
	}